

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::Equals,false,false,false,true>
                (uhugeint_t *ldata,uhugeint_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  sel_t sVar7;
  ulong uVar8;
  ulong uVar9;
  uhugeint_t *puVar10;
  uhugeint_t *puVar11;
  ulong uVar12;
  long lVar13;
  unsigned_long uVar14;
  
  if (count + 0x3f < 0x40) {
    lVar13 = 0;
  }
  else {
    lVar13 = 0;
    uVar6 = 0;
    uVar12 = 0;
    do {
      puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar14 = 0xffffffffffffffff;
      }
      else {
        uVar14 = puVar1[uVar6];
      }
      uVar8 = uVar12 + 0x40;
      if (count <= uVar12 + 0x40) {
        uVar8 = count;
      }
      uVar9 = uVar12;
      if (uVar14 == 0xffffffffffffffff) {
        if (uVar12 < uVar8) {
          puVar10 = rdata + uVar12;
          puVar11 = ldata + uVar12;
          do {
            uVar9 = uVar12;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar9 = (ulong)sel->sel_vector[uVar12];
            }
            bVar4 = uhugeint_t::operator==(puVar11,puVar10);
            false_sel->sel_vector[lVar13] = (sel_t)uVar9;
            lVar13 = lVar13 + (ulong)!bVar4;
            uVar12 = uVar12 + 1;
            puVar10 = puVar10 + 1;
            puVar11 = puVar11 + 1;
            uVar9 = uVar12;
          } while (uVar8 != uVar12);
        }
      }
      else if (uVar14 == 0) {
        uVar9 = uVar8;
        if (uVar12 < uVar8) {
          psVar2 = sel->sel_vector;
          psVar3 = false_sel->sel_vector;
          do {
            sVar7 = (sel_t)uVar12;
            if (psVar2 != (sel_t *)0x0) {
              sVar7 = psVar2[uVar12];
            }
            psVar3[lVar13] = sVar7;
            lVar13 = lVar13 + 1;
            uVar12 = uVar12 + 1;
          } while (uVar8 != uVar12);
        }
      }
      else if (uVar12 < uVar8) {
        puVar10 = rdata + uVar12;
        puVar11 = ldata + uVar12;
        uVar9 = 0;
        do {
          if (sel->sel_vector == (sel_t *)0x0) {
            sVar7 = (int)uVar9 + (int)uVar12;
          }
          else {
            sVar7 = sel->sel_vector[uVar12 + uVar9];
          }
          if ((uVar14 >> (uVar9 & 0x3f) & 1) == 0) {
            uVar5 = 1;
          }
          else {
            bVar4 = uhugeint_t::operator==(puVar11,puVar10);
            uVar5 = (ulong)!bVar4;
          }
          false_sel->sel_vector[lVar13] = sVar7;
          lVar13 = lVar13 + uVar5;
          uVar9 = uVar9 + 1;
          puVar10 = puVar10 + 1;
          puVar11 = puVar11 + 1;
        } while ((uVar12 - uVar8) + uVar9 != 0);
        uVar9 = uVar12 + uVar9;
      }
      uVar6 = uVar6 + 1;
      uVar12 = uVar9;
    } while (uVar6 != count + 0x3f >> 6);
  }
  return count - lVar13;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}